

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int ncnn::convolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int extraout_EAX;
  int iVar11;
  ulong uVar12;
  int iVar13;
  void *pvVar14;
  int iVar15;
  void *pvVar16;
  Mat *pMVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  size_type __n;
  int j;
  void *pvVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_148;
  allocator_type local_131;
  Mat *local_130;
  void *local_128;
  float *local_120;
  void *local_118;
  ulong local_110;
  ulong local_108;
  Mat *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  long local_e0;
  void *local_d8;
  ulong local_d0;
  void *local_c8;
  int local_c0;
  int local_bc;
  Mat *local_b8;
  Mat *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  long local_80;
  long local_78;
  void *local_70;
  long local_68;
  void *local_60;
  long local_58;
  long local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar10 = bottom_blob->w;
  if (bias_data->data == (void *)0x0) {
    bVar24 = true;
  }
  else {
    bVar24 = (long)bias_data->c * bias_data->cstep == 0;
  }
  local_118 = (void *)CONCAT44(local_118._4_4_,bottom_blob->c);
  local_110 = (ulong)top_blob->w;
  uVar9 = top_blob->h;
  iVar2 = top_blob->c;
  uVar7 = kernel_h * kernel_w;
  __n = (size_type)(int)uVar7;
  local_130 = bottom_blob;
  local_100 = top_blob;
  local_b8 = weight_data;
  local_b0 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,&local_131);
  iVar8 = 0;
  iVar4 = kernel_w;
  if (kernel_w < 1) {
    iVar4 = iVar8;
  }
  if (kernel_h < 1) {
    kernel_h = iVar8;
  }
  iVar13 = 0;
  iVar15 = 0;
  iVar11 = iVar4;
  for (; iVar8 != kernel_h; iVar8 = iVar8 + 1) {
    for (lVar18 = (long)iVar15; iVar11 != lVar18; lVar18 = lVar18 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[lVar18] = iVar13;
      iVar13 = iVar13 + dilation_w;
    }
    iVar13 = iVar13 + (iVar10 * dilation_h - dilation_w * kernel_w);
    iVar11 = iVar11 + iVar4;
    iVar15 = iVar4 + iVar15;
  }
  if (iVar2 == group && (int)local_118 == group) {
    local_d8 = local_100->data;
    local_e0 = local_100->cstep * local_100->elemsize;
    pvVar21 = local_b8->data;
    local_e8 = local_130->data;
    local_f0 = (void *)(local_130->cstep * local_130->elemsize);
    pvVar16 = (void *)0x0;
    uVar20 = 0;
    if (0 < (int)uVar7) {
      uVar20 = (ulong)uVar7;
    }
    pMVar17 = (Mat *)(long)stride_w;
    uVar19 = 0;
    if (0 < (int)local_110) {
      uVar19 = local_110 & 0xffffffff;
    }
    pvVar22 = (void *)(ulong)uVar9;
    if ((int)uVar9 < 1) {
      pvVar22 = pvVar16;
    }
    local_f8 = (void *)(ulong)(uint)group;
    if (group < 1) {
      local_f8 = pvVar16;
    }
    local_d0 = (long)stride_h * (long)local_130->w * local_130->elemsize;
    local_130 = pMVar17;
    local_108 = uVar19;
    for (; pvVar16 != local_f8; pvVar16 = (void *)((long)pvVar16 + 1)) {
      local_148 = (void *)(local_e0 * (long)pvVar16 + (long)local_d8);
      local_a8._0_8_ = (void *)((long)local_f0 * (long)pvVar16 + (long)local_e8);
      pvVar14 = (void *)0x0;
      local_128 = pvVar16;
      while (pvVar14 != pvVar22) {
        local_118 = local_b0->data;
        lVar18 = (long)pvVar14 * local_d0 + local_a8._0_8_;
        local_120 = (float *)activation_params->data;
        local_c8 = pvVar14;
        for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
          uVar12 = 0;
          if (!bVar24) {
            uVar12 = (ulong)*(uint *)((long)local_118 + (long)pvVar16 * 4);
          }
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar12;
          uVar12 = 0;
          while( true ) {
            fVar25 = auVar28._0_4_;
            if (uVar20 == uVar12) break;
            auVar28._0_4_ =
                 fVar25 + *(float *)((long)pvVar21 + uVar12 * 4) *
                          *(float *)(lVar18 + uVar23 * (long)pMVar17 * 4 +
                                    (long)local_48._M_impl.super__Vector_impl_data._M_start[uVar12]
                                    * 4);
            uVar12 = uVar12 + 1;
          }
          switch(activation_type) {
          case 1:
            if (fVar25 <= 0.0) {
              auVar5._12_4_ = 0;
              auVar5._0_12_ = auVar28._4_12_;
              auVar28 = auVar5 << 0x20;
            }
          default:
switchD_00395c03_default:
            fVar26 = auVar28._0_4_;
            break;
          case 2:
            fVar26 = (float)(~-(uint)(0.0 < fVar25) & (uint)*local_120 |
                            -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
            break;
          case 3:
            if (fVar25 <= *local_120) {
              auVar28._0_4_ = *local_120;
            }
            fVar26 = local_120[1];
            if (auVar28._0_4_ <= fVar26) {
              fVar26 = auVar28._0_4_;
            }
            break;
          case 4:
            if (88.37626 <= fVar25) {
              fVar25 = 88.37626;
            }
            fVar25 = expf((float)(-(uint)(fVar25 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar25 < -88.37626) & (uint)-fVar25));
            pvVar16 = local_128;
            pMVar17 = local_130;
            uVar19 = local_108;
            fVar26 = 1.0 / (fVar25 + 1.0);
            break;
          case 5:
            local_98 = auVar28;
            fVar25 = expf(fVar25);
            fVar25 = logf(fVar25 + 1.0);
            fVar25 = tanhf(fVar25);
            pvVar16 = local_128;
            pMVar17 = local_130;
            uVar19 = local_108;
            fVar26 = fVar25 * (float)local_98._0_4_;
            break;
          case 6:
            fVar1 = *local_120;
            fVar27 = -local_120[1] / fVar1;
            fVar26 = 0.0;
            if (fVar27 <= fVar25) {
              if (fVar27 + 1.0 / fVar1 < fVar25) goto switchD_00395c03_default;
              fVar26 = (fVar1 * fVar25 + local_120[1]) * fVar25;
            }
          }
          *(float *)((long)local_148 + uVar23 * 4) = fVar26;
        }
        local_148 = (void *)((long)local_148 + local_110 * 4);
        pvVar14 = (void *)((long)local_c8 + 1);
      }
      pvVar21 = (void *)((long)pvVar21 + __n * 4);
    }
  }
  else {
    uVar9 = iVar2 / group;
    iVar10 = (int)((long)(int)local_118 / (long)group);
    uVar20 = 0;
    if (0 < (int)uVar7) {
      uVar20 = (ulong)uVar7;
    }
    uVar19 = 0;
    if (0 < iVar10) {
      uVar19 = (long)(int)local_118 / (long)group & 0xffffffff;
    }
    local_108 = (ulong)stride_w;
    local_e8 = (void *)(long)stride_h;
    local_f0 = (void *)0x0;
    if (0 < (int)uVar9) {
      local_f0 = (void *)(ulong)uVar9;
    }
    local_78 = (long)iVar10;
    local_80 = (long)(int)uVar9;
    if (group < 1) {
      group = 0;
    }
    local_f8 = (void *)(ulong)(uint)group;
    local_c0 = uVar9 * iVar10 * uVar7;
    local_68 = (long)(int)(iVar10 * uVar7) << 2;
    iVar10 = 0;
    pvVar21 = (void *)0x0;
    while (pvVar21 != local_f8) {
      local_58 = local_100->cstep * local_100->elemsize;
      local_50 = (long)pvVar21 * local_80;
      uVar9 = local_100->w;
      local_e0 = (long)(int)uVar9;
      lVar18 = (long)pvVar21 * local_78;
      local_118 = (void *)0x0;
      if (0 < (int)uVar9) {
        local_118 = (void *)(ulong)uVar9;
      }
      uVar9 = local_100->h;
      if (local_100->h < 1) {
        uVar9 = 0;
      }
      local_d0 = (ulong)uVar9;
      local_60 = local_100->data;
      local_128 = (void *)((long)iVar10 * 4 + (long)local_b8->data);
      pvVar16 = (void *)0x0;
      local_bc = iVar10;
      local_70 = pvVar21;
      while (pvVar16 != local_f0) {
        local_c8 = (void *)((long)pvVar16 + local_50);
        local_148 = (void *)(local_58 * (long)local_c8 + (long)local_60);
        uVar23 = 0;
        local_d8 = pvVar16;
        while (uVar23 != local_d0) {
          local_98._0_8_ = local_b0->data;
          local_120 = (float *)(uVar23 * (long)local_e8);
          pfVar3 = (float *)activation_params->data;
          local_110 = uVar23;
          for (pvVar21 = (void *)0x0; pvVar21 != local_118; pvVar21 = (void *)((long)pvVar21 + 1)) {
            uVar23 = 0;
            if (!bVar24) {
              uVar23 = (ulong)*(uint *)(local_98._0_8_ + (long)local_c8 * 4);
            }
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar23;
            pvVar16 = local_128;
            for (uVar23 = 0; fVar25 = auVar29._0_4_, uVar23 != uVar19; uVar23 = uVar23 + 1) {
              for (uVar12 = 0; uVar20 != uVar12; uVar12 = uVar12 + 1) {
                auVar29._0_4_ =
                     auVar29._0_4_ +
                     *(float *)((long)pvVar16 + uVar12 * 4) *
                     *(float *)((long)local_130->data +
                               (long)local_48._M_impl.super__Vector_impl_data._M_start[uVar12] * 4 +
                               (uVar23 + lVar18) * local_130->cstep * local_130->elemsize +
                               (long)pvVar21 * local_108 * 4 +
                               (long)local_130->w * (long)local_120 * local_130->elemsize);
              }
              pvVar16 = (void *)((long)pvVar16 + __n * 4);
            }
            switch(activation_type) {
            case 1:
              if (fVar25 <= 0.0) {
                auVar6._12_4_ = 0;
                auVar6._0_12_ = auVar29._4_12_;
                auVar29 = auVar6 << 0x20;
              }
            default:
switchD_00396019_default:
              fVar26 = auVar29._0_4_;
              break;
            case 2:
              fVar26 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar3 |
                              -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
              break;
            case 3:
              if (fVar25 <= *pfVar3) {
                auVar29._0_4_ = *pfVar3;
              }
              fVar26 = pfVar3[1];
              if (auVar29._0_4_ <= fVar26) {
                fVar26 = auVar29._0_4_;
              }
              break;
            case 4:
              if (88.37626 <= fVar25) {
                fVar25 = 88.37626;
              }
              fVar25 = expf((float)(-(uint)(fVar25 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar25 < -88.37626) & (uint)-fVar25));
              fVar26 = 1.0 / (fVar25 + 1.0);
              break;
            case 5:
              local_a8 = auVar29;
              fVar25 = expf(fVar25);
              fVar25 = logf(fVar25 + 1.0);
              fVar25 = tanhf(fVar25);
              fVar26 = fVar25 * (float)local_a8._0_4_;
              break;
            case 6:
              fVar1 = *pfVar3;
              fVar27 = -pfVar3[1] / fVar1;
              fVar26 = 0.0;
              if (fVar27 <= fVar25) {
                if (fVar27 + 1.0 / fVar1 < fVar25) goto switchD_00396019_default;
                fVar26 = (fVar1 * fVar25 + pfVar3[1]) * fVar25;
              }
            }
            *(float *)((long)local_148 + (long)pvVar21 * 4) = fVar26;
          }
          local_148 = (void *)((long)local_148 + local_e0 * 4);
          uVar23 = local_110 + 1;
        }
        local_128 = (void *)((long)local_128 + local_68);
        pvVar16 = (void *)((long)local_d8 + 1);
      }
      iVar10 = local_bc + local_c0;
      pvVar21 = (void *)((long)local_70 + 1);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return extraout_EAX;
}

Assistant:

static int convolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                float* outptr = top_blob.channel(g * outch_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[outch_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const Mat m = bottom_blob.channel(inch_g * g + q);
                            const float* sptr = m.row(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[space_ofs[k]];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}